

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O3

void write_buf(voidp buf,uint cnt)

{
  ulong __n;
  void *pvVar1;
  size_t sVar2;
  long lVar3;
  char *err_message;
  
  __n = (ulong)buf & 0xffffffff;
  if (realloc_fn == (_func_void_ptr_void_ptr_size_t *)0x0) {
    sVar2 = fwrite(outbuf,1,__n,(FILE *)ofd);
    if (sVar2 == __n) {
      return;
    }
    ffpmsg(ifname);
    err_message = "failed to write buffer to uncompressed output file (write_buf)";
LAB_001baf79:
    ffpmsg(err_message);
    return;
  }
  pvVar1 = *memptr;
  lVar3 = bytes_out;
  if (*memsize < bytes_out + __n) {
    pvVar1 = (*realloc_fn)(pvVar1,bytes_out + __n);
    *memptr = pvVar1;
    lVar3 = bytes_out;
    *memsize = bytes_out + __n;
    if (pvVar1 == (void *)0x0) {
      ffpmsg(ifname);
      err_message = "malloc failed while uncompressing (write_buf)";
      goto LAB_001baf79;
    }
  }
  memcpy((void *)(lVar3 + (long)pvVar1),outbuf,__n);
  return;
}

Assistant:

local void write_buf(voidp buf, unsigned cnt)
/*              copy buffer into memory; allocate more memory if required*/
{
    if (!realloc_fn)
    {
      /* append buffer to file */
      /* added 'unsigned' to get rid of compiler warning (WDP 1/1/99) */
      if ((unsigned long) fwrite(buf, 1, cnt, ofd) != cnt)
      {
          error
          ("failed to write buffer to uncompressed output file (write_buf)");
          exit_code = ERROR;
          return;
      }
    }
    else
    {
      /* get more memory if current buffer is too small */
      if (bytes_out + cnt > *memsize)
      {
        *memptr = realloc_fn(*memptr, bytes_out + cnt);
        *memsize = bytes_out + cnt;  /* new memory buffer size */

        if (!(*memptr))
        {
            error("malloc failed while uncompressing (write_buf)");
            exit_code = ERROR;
            return;
        }  
      }
      /* copy  into memory buffer */
      memcpy((char *) *memptr + bytes_out, (char *) buf, cnt);
    }
}